

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmi_info.hpp
# Opt level: O1

void __thiscall license::os::DmiInfo::~DmiInfo(DmiInfo *this)

{
  ~DmiInfo(this);
  operator_delete(this);
  return;
}

Assistant:

const std::string& bios_vendor() const { return m_bios_vendor; }